

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int binchr(bstring b0,int pos,bstring b1)

{
  int iVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar6;
  charField chrs;
  charField local_60;
  ulong uVar5;
  
  if ((b0 != (bstring)0x0 && -1 < pos) && (puVar2 = b0->data, puVar2 != (uchar *)0x0)) {
    uVar5 = (ulong)(uint)pos;
    iVar1 = b0->slen;
    if ((pos < iVar1) && (iVar3 = buildCharField(&local_60,b1), -1 < iVar3)) {
      pbVar6 = puVar2 + uVar5;
      do {
        if (((uint)local_60.content[*pbVar6 >> 5] >> (*pbVar6 & 0x1f) & 1) != 0) {
          return (int)uVar5;
        }
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
        pbVar6 = pbVar6 + 1;
      } while ((int)uVar4 < iVar1);
    }
  }
  return -1;
}

Assistant:

int binchr (const bstring b0, int pos, const bstring b1) {
struct charField chrs;
	if (pos < 0 || b0 == NULL || b0->data == NULL ||
	    b0->slen <= pos) return BSTR_ERR;
	if (buildCharField (&chrs, b1) < 0) return BSTR_ERR;
	return binchrCF (b0->data, b0->slen, pos, &chrs);
}